

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O0

void __thiscall cmCursesOptionsWidget::NextOption(cmCursesOptionsWidget *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  cmCursesOptionsWidget *this_local;
  
  this->CurrentOption = this->CurrentOption + 1;
  uVar1 = this->CurrentOption;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->Options);
  if (sVar2 - 1 < uVar1) {
    this->CurrentOption = 0;
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->Options,this->CurrentOption);
  (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,pvVar3);
  return;
}

Assistant:

void cmCursesOptionsWidget::NextOption()
{
  this->CurrentOption++;
  if(this->CurrentOption > this->Options.size()-1)
    {
    this->CurrentOption = 0;
    }
  this->SetValue(this->Options[this->CurrentOption]);
}